

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int al_fputs(ALLEGRO_FILE *f,char *p)

{
  ALLEGRO_FILE *f_00;
  ALLEGRO_FILE *pAVar1;
  char *in_RSI;
  size_t n;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  f_00 = (ALLEGRO_FILE *)strlen(in_RSI);
  pAVar1 = (ALLEGRO_FILE *)al_fwrite(f_00,in_stack_ffffffffffffffd8,0x175eb1);
  if (pAVar1 == f_00) {
    local_4 = (int)f_00;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int al_fputs(ALLEGRO_FILE *f, char const *p)
{
   size_t n;
   ASSERT(f);
   ASSERT(p);

   n = strlen(p);
   if (al_fwrite(f, p, n) != n) {
      return EOF;
   }

   return n;
}